

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_OStream.cc
# Opt level: O3

void __thiscall Pl_OStream::~Pl_OStream(Pl_OStream *this)

{
  ~Pl_OStream(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

Pl_OStream::~Pl_OStream() = default;